

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzerResults.cpp
# Opt level: O2

void __thiscall
USBAnalyzerResults::GenerateExportFileControlTransfers
          (USBAnalyzerResults *this,char *file,DisplayBase display_base)

{
  undefined8 uVar1;
  undefined2 uVar2;
  char cVar3;
  ulonglong uVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ulonglong uVar7;
  Frame f;
  USB_PID local_308;
  char local_2f8;
  char cStack_2f7;
  ulong local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  undefined2 local_2b8;
  USBStringContainer *local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  results;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270;
  string local_250;
  ofstream file_stream;
  
  std::ofstream::ofstream(&file_stream,file,_S_out);
  Analyzer::GetTriggerSample();
  Analyzer::GetSampleRate();
  Frame::Frame(&f);
  uVar4 = AnalyzerResults::GetNumFrames();
  results.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  results.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  results.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b0 = &this->mAllStringDescriptors;
  local_2e8 = 0;
  for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
    AnalyzerResults::GetFrame((ulonglong)&local_2d8);
    uVar2 = local_2b8;
    uVar1 = local_2d8.field_2._M_allocated_capacity;
    _f = local_2d8._M_dataplus._M_p;
    Frame::~Frame((Frame *)&local_2d8);
    cVar3 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar7);
    if (cVar3 != '\0') goto LAB_00131896;
    local_2f8 = (char)uVar2;
    if (local_2f8 == '\x04') {
      local_2e8 = uVar1 & 0xffffffff;
    }
    else {
      local_2e8 = local_2e8 & 0xff;
    }
    cStack_2f7 = (char)((ushort)uVar2 >> 8);
    pbVar6 = &local_2d8;
    switch(cStack_2f7) {
    case '\x02':
      poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&file_stream);
      int2str_sal_abi_cxx11_(&local_250,local_2e8 & 0xff,display_base,7);
      std::operator+(&local_290,"SETUP address: ",&local_250);
      std::operator+(&local_2d8,&local_290," time: ");
      poVar5 = std::operator<<(poVar5,(string *)&local_2d8);
      GetSampleTimeStr_abi_cxx11_(&local_270,this,(S64)_f);
      poVar5 = std::operator<<(poVar5,(string *)&local_270);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_290);
      pbVar6 = &local_250;
      break;
    case '\x03':
      poVar5 = std::operator<<((ostream *)&file_stream,"DATA time: ");
      GetSampleTimeStr_abi_cxx11_(&local_2d8,this,(S64)_f);
      poVar5 = std::operator<<(poVar5,(string *)&local_2d8);
      std::endl<char,std::char_traits<char>>(poVar5);
      break;
    case '\x04':
      poVar5 = std::operator<<((ostream *)&file_stream,"Descriptor time: ");
      GetSampleTimeStr_abi_cxx11_(&local_2d8,this,(S64)_f);
      poVar5 = std::operator<<(poVar5,(string *)&local_2d8);
      std::endl<char,std::char_traits<char>>(poVar5);
      break;
    default:
      goto switchD_0013144a_caseD_5;
    case '\b':
      poVar5 = std::operator<<((ostream *)&file_stream,"STATUS time: ");
      GetSampleTimeStr_abi_cxx11_(&local_2d8,this,(S64)_f);
      poVar5 = std::operator<<(poVar5,(string *)&local_2d8);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    std::__cxx11::string::~string((string *)pbVar6);
switchD_0013144a_caseD_5:
    if (cStack_2f7 == '\x01' || 1 < (byte)(local_2f8 - 0xdU)) {
      if (local_2f8 == '\x06') {
        poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&file_stream);
        poVar5 = std::operator<<(poVar5,"USB RESET Time: ");
        GetSampleTimeStr_abi_cxx11_(&local_2d8,this,(S64)_f);
        poVar5 = std::operator<<(poVar5,(string *)&local_2d8);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::string::~string((string *)&local_2d8);
      }
    }
    else {
      GetFrameDesc(&f,display_base,&results,local_2b0);
      poVar5 = std::operator<<((ostream *)&file_stream,"\t");
      poVar5 = std::operator<<(poVar5,(string *)
                                      results.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    local_308 = (USB_PID)uVar1;
    switch(cStack_2f7) {
    case '\x05':
      poVar5 = std::operator<<((ostream *)&file_stream,"\t<data IN packet NAKed by device. Time: ");
      GetSampleTimeStr_abi_cxx11_(&local_2d8,this,(S64)_f);
      poVar5 = std::operator<<(poVar5,(string *)&local_2d8);
      poVar5 = std::operator<<(poVar5,'>');
      std::endl<char,std::char_traits<char>>(poVar5);
      break;
    case '\x06':
      poVar5 = std::operator<<((ostream *)&file_stream,"\t<data OUT packet NAKed by device. Time: ")
      ;
      GetSampleTimeStr_abi_cxx11_(&local_2d8,this,(S64)_f);
      poVar5 = std::operator<<(poVar5,(string *)&local_2d8);
      poVar5 = std::operator<<(poVar5,'>');
      std::endl<char,std::char_traits<char>>(poVar5);
      break;
    default:
      goto switchD_0013169f_caseD_7;
    case '\t':
      poVar5 = std::operator<<((ostream *)&file_stream,
                               "\t<status OUT data packet NAKed by device. Time: ");
      GetSampleTimeStr_abi_cxx11_(&local_2d8,this,(S64)_f);
      poVar5 = std::operator<<(poVar5,(string *)&local_2d8);
      poVar5 = std::operator<<(poVar5,'>');
      std::endl<char,std::char_traits<char>>(poVar5);
      break;
    case '\n':
      poVar5 = std::operator<<((ostream *)&file_stream,"\t<status IN packet NAKed by device. Time: "
                              );
      GetSampleTimeStr_abi_cxx11_(&local_2d8,this,(S64)_f);
      poVar5 = std::operator<<(poVar5,(string *)&local_2d8);
      poVar5 = std::operator<<(poVar5,'>');
      std::endl<char,std::char_traits<char>>(poVar5);
      break;
    case '\v':
      poVar5 = std::operator<<((ostream *)&file_stream,"\t");
      GetPIDName_abi_cxx11_(&local_2d8,local_308);
      poVar5 = std::operator<<(poVar5,(string *)&local_2d8);
      std::endl<char,std::char_traits<char>>(poVar5);
      break;
    case '\f':
      poVar5 = std::operator<<((ostream *)&file_stream,"Unexpected packet ");
      GetPIDName_abi_cxx11_(&local_2d8,local_308);
      poVar5 = std::operator<<(poVar5,(string *)&local_2d8);
      poVar5 = std::operator<<(poVar5,". Time: ");
      GetSampleTimeStr_abi_cxx11_(&local_290,this,(S64)_f);
      poVar5 = std::operator<<(poVar5,(string *)&local_290);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::~string((string *)&local_290);
    }
    std::__cxx11::string::~string((string *)&local_2d8);
switchD_0013169f_caseD_7:
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar4);
LAB_00131896:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&results);
  Frame::~Frame(&f);
  std::ofstream::~ofstream(&file_stream);
  return;
}

Assistant:

void USBAnalyzerResults::GenerateExportFileControlTransfers( const char* file, DisplayBase display_base )
{
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    Frame f;
    const U64 num_frames = GetNumFrames();
    std::vector<std::string> results;
    U8 address = 0;
    for( U64 fcnt = 0; fcnt < num_frames; fcnt++ )
    {
        // get the frame
        f = GetFrame( fcnt );

        if( UpdateExportProgressAndCheckForCancel( fcnt, num_frames ) )
            return;

        if( f.mType == FT_AddrEndp )
            address = U8( f.mData1 );

        if( f.mFlags == FF_StatusBegin )
            file_stream << "STATUS time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << std::endl;
        else if( f.mFlags == FF_DataBegin )
            file_stream << "DATA time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << std::endl;
        else if( f.mFlags == FF_DataDescriptor )
            file_stream << "Descriptor time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << std::endl;
        else if( f.mFlags == FF_SetupBegin )
            file_stream << std::endl
                        << "SETUP address: " + int2str_sal( address, display_base, 7 ) + " time: "
                        << GetSampleTimeStr( f.mStartingSampleInclusive ) << std::endl;

        if( ( f.mType == FT_ControlTransferField || f.mType == FT_HIDReportDescriptorItem ) && f.mFlags != FF_FieldIncomplete )
        {
            GetFrameDesc( f, display_base, results, mAllStringDescriptors );

            // output the packet
            file_stream << "\t" << results.front() << std::endl;
        }
        else if( f.mType == FT_Reset )
        {
            file_stream << std::endl << "USB RESET Time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << std::endl;
        }

        if( f.mFlags == FF_StatusEnd )
            file_stream << "\t" << GetPIDName( USB_PID( f.mData1 ) ) << std::endl;
        else if( f.mFlags == FF_DataInNAKed )
            file_stream << "\t<data IN packet NAKed by device. Time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << '>'
                        << std::endl;
        else if( f.mFlags == FF_DataOutNAKed )
            file_stream << "\t<data OUT packet NAKed by device. Time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << '>'
                        << std::endl;
        else if( f.mFlags == FF_StatusInNAKed )
            file_stream << "\t<status IN packet NAKed by device. Time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << '>'
                        << std::endl;
        else if( f.mFlags == FF_StatusOutNAKed )
            file_stream << "\t<status OUT data packet NAKed by device. Time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << '>'
                        << std::endl;
        else if( f.mFlags == FF_UnexpectedPacket )
            file_stream << "Unexpected packet " << GetPIDName( USB_PID( f.mData1 ) )
                        << ". Time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << std::endl;
    }

    // end
    UpdateExportProgressAndCheckForCancel( num_frames, num_frames );
}